

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptArray * __thiscall
Js::JavascriptLibrary::CreateArray(JavascriptLibrary *this,uint32 length,uint32 size)

{
  code *pcVar1;
  uint32 size_00;
  uint32 length_00;
  bool bVar2;
  DynamicType **ppDVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  JavascriptArray *this_00;
  TrackAllocData local_48;
  JavascriptArray *local_20;
  JavascriptArray *arr;
  uint32 size_local;
  uint32 length_local;
  JavascriptLibrary *this_local;
  
  arr._0_4_ = size;
  arr._4_4_ = length;
  _size_local = this;
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->arrayType);
  if (*ppDVar3 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x178a,"(arrayType)","Where\'s arrayType?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&Js::JavascriptArray::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x178b);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_48);
  this_00 = (JavascriptArray *)new<Memory::Recycler>(0x38,pRVar5,0x43c4b0);
  length_00 = arr._4_4_;
  size_00 = (uint32)arr;
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->arrayType);
  Js::JavascriptArray::JavascriptArray(this_00,length_00,size_00,*ppDVar3);
  local_20 = this_00;
  Js::JavascriptArray::CheckForceES5Array(this_00);
  return local_20;
}

Assistant:

JavascriptArray* JavascriptLibrary::CreateArray(uint32 length, uint32 size)
    {
        AssertMsg(arrayType, "Where's arrayType?");
        JavascriptArray* arr = RecyclerNew(this->GetRecycler(), JavascriptArray, length, size, arrayType);
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_ARRAY(arr));

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif
        return arr;
    }